

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O0

int ravi_dump_luacode(lua_State *L)

{
  int iVar1;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  if (iVar1 != 1) {
    luaL_argerror(L,1,"1 argument expected");
  }
  iVar1 = lua_type(L,1);
  if (iVar1 == 6) {
    iVar1 = lua_iscfunction(L,1);
    if (iVar1 == 0) goto LAB_001627df;
  }
  luaL_argerror(L,1,"argument must be a Lua function");
LAB_001627df:
  ravi_dump_function(L);
  return 0;
}

Assistant:

static int ravi_dump_luacode(lua_State *L) {
  int n = lua_gettop(L);
  luaL_argcheck(L, n == 1, 1, "1 argument expected");
  luaL_argcheck(L, lua_isfunction(L, 1) && !lua_iscfunction(L, 1), 1,
                "argument must be a Lua function");
  ravi_dump_function(L);
  return 0;
}